

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O1

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadSkeletonAnimationTrack
          (OgreBinarySerializer *this,Skeleton *param_1,Animation *dest)

{
  StreamReader<false,_false> *this_00;
  unsigned_short uVar1;
  uint uVar2;
  Bone *pBVar3;
  runtime_error *this_01;
  MemoryStreamReader *this_02;
  bool bVar4;
  VertexAnimationTrack track;
  string local_1c0 [32];
  undefined1 local_1a0 [8];
  _Alloc_hider local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  vector<Assimp::Ogre::PoseKeyFrame,_std::allocator<Assimp::Ogre::PoseKeyFrame>_> local_178;
  vector<Assimp::Ogre::MorphKeyFrame,_std::allocator<Assimp::Ogre::MorphKeyFrame>_> local_160;
  pointer local_148;
  pointer local_138;
  
  uVar1 = StreamReader<false,_false>::Get<unsigned_short>(this->m_reader);
  pBVar3 = Skeleton::BoneById(dest->parentSkeleton,uVar1);
  if (pBVar3 != (Bone *)0x0) {
    VertexAnimationTrack::VertexAnimationTrack((VertexAnimationTrack *)local_1a0);
    local_1a0._0_4_ = VAT_TRANSFORM;
    std::__cxx11::string::_M_assign((string *)&local_198);
    uVar1 = StreamReader<false,_false>::Get<unsigned_short>(this->m_reader);
    uVar2 = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
    this->m_currentLen = uVar2;
    this_02 = this->m_reader;
    bVar4 = *(int *)&this_02->end == *(int *)&this_02->current;
    if (uVar1 == 0x4110 && !bVar4) {
      do {
        ReadSkeletonAnimationKeyFrame(this,(VertexAnimationTrack *)local_1a0);
        this_00 = this->m_reader;
        if (*(int *)&this_00->end != *(int *)&this_00->current) {
          uVar1 = StreamReader<false,_false>::Get<unsigned_short>(this_00);
          uVar2 = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
          this->m_currentLen = uVar2;
        }
        this_02 = this->m_reader;
        bVar4 = *(int *)&this_02->end == *(int *)&this_02->current;
      } while ((!bVar4) && (uVar1 == 0x4110));
    }
    if (!bVar4) {
      StreamReader<false,_false>::IncPtr(this_02,-6);
    }
    std::
    vector<Assimp::Ogre::VertexAnimationTrack,_std::allocator<Assimp::Ogre::VertexAnimationTrack>_>
    ::push_back(&dest->tracks,(value_type *)local_1a0);
    if (local_148 != (pointer)0x0) {
      operator_delete(local_148,(long)local_138 - (long)local_148);
    }
    std::vector<Assimp::Ogre::MorphKeyFrame,_std::allocator<Assimp::Ogre::MorphKeyFrame>_>::~vector
              (&local_160);
    std::vector<Assimp::Ogre::PoseKeyFrame,_std::allocator<Assimp::Ogre::PoseKeyFrame>_>::~vector
              (&local_178);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198._M_p != &local_188) {
      operator_delete(local_198._M_p,local_188._M_allocated_capacity + 1);
    }
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"Cannot read animation track, target bone ",0x29);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0," not in target Skeleton",0x17);
  std::__cxx11::stringbuf::str();
  std::runtime_error::runtime_error(this_01,local_1c0);
  *(undefined ***)this_01 = &PTR__runtime_error_0082bce0;
  __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void OgreBinarySerializer::ReadSkeletonAnimationTrack(Skeleton * /*skeleton*/, Animation *dest)
{
    uint16_t boneId = Read<uint16_t>();
    Bone *bone = dest->parentSkeleton->BoneById(boneId);
    if (!bone) {
        throw DeadlyImportError(Formatter::format() << "Cannot read animation track, target bone " << boneId << " not in target Skeleton");
    }

    VertexAnimationTrack track;
    track.type = VertexAnimationTrack::VAT_TRANSFORM;
    track.boneName = bone->name;

    uint16_t id = ReadHeader();
    while (!AtEnd() && id == SKELETON_ANIMATION_TRACK_KEYFRAME)
    {
        ReadSkeletonAnimationKeyFrame(&track);

        if (!AtEnd())
            id = ReadHeader();
    }
    if (!AtEnd())
        RollbackHeader();

    dest->tracks.push_back(track);
}